

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O1

int run_test_pipe_bind_error_addrinuse(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  code *unaff_RBX;
  long *plVar4;
  undefined1 *puVar5;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_pipe_t server2;
  uv_pipe_t server1;
  undefined1 auStack_1288 [16];
  uv_loop_t *puStack_1278;
  uv_connect_t uStack_1270;
  uv_pipe_t uStack_1208;
  long alStack_1120 [64];
  uv_loop_t *puStack_f20;
  long lStack_f10;
  long lStack_f08;
  undefined1 auStack_f00 [264];
  uv_pipe_t uStack_df8;
  uv_loop_t auStack_d10 [2];
  undefined1 uStack_511;
  uv_loop_t *puStack_510;
  long lStack_500;
  long lStack_4f8;
  uv_pipe_t uStack_4f0;
  uv_loop_t *puStack_408;
  long lStack_3f8;
  long lStack_3f0;
  uv_pipe_t uStack_3e8;
  uv_loop_t *puStack_300;
  long lStack_2f0;
  long lStack_2e8;
  uv_pipe_t uStack_2e0;
  uv_loop_t *puStack_1f8;
  code *pcStack_1f0;
  long local_1e8;
  long local_1e0;
  uv_pipe_t local_1d8;
  uv_pipe_t local_f0;
  
  pcStack_1f0 = (code *)0x1ac5a9;
  puVar2 = uv_default_loop();
  pcStack_1f0 = (code *)0x1ac5bb;
  iVar1 = uv_pipe_init(puVar2,&local_f0,0);
  local_1d8.data = (void *)(long)iVar1;
  local_1e8 = 0;
  if (local_1d8.data == (void *)0x0) {
    pcStack_1f0 = (code *)0x1ac5ed;
    iVar1 = uv_pipe_bind(&local_f0,"/tmp/uv-test-sock");
    local_1d8.data = (void *)(long)iVar1;
    local_1e8 = 0;
    if (local_1d8.data != (void *)0x0) goto LAB_001ac78a;
    pcStack_1f0 = (code *)0x1ac610;
    puVar2 = uv_default_loop();
    pcStack_1f0 = (code *)0x1ac61f;
    iVar1 = uv_pipe_init(puVar2,&local_1d8,0);
    local_1e8 = (long)iVar1;
    local_1e0 = 0;
    if (local_1e8 != 0) goto LAB_001ac797;
    pcStack_1f0 = (code *)0x1ac64e;
    iVar1 = uv_pipe_bind(&local_1d8,"/tmp/uv-test-sock");
    local_1e8 = (long)iVar1;
    local_1e0 = -0x62;
    if (local_1e8 != -0x62) goto LAB_001ac7a4;
    pcStack_1f0 = (code *)0x1ac680;
    iVar1 = uv_listen((uv_stream_t *)&local_f0,0x1000,(uv_connection_cb)0x0);
    local_1e8 = (long)iVar1;
    local_1e0 = 0;
    if (local_1e8 != 0) goto LAB_001ac7b1;
    pcStack_1f0 = (code *)0x1ac6af;
    iVar1 = uv_listen((uv_stream_t *)&local_1d8,0x1000,(uv_connection_cb)0x0);
    local_1e8 = (long)iVar1;
    local_1e0 = -0x16;
    if (local_1e8 != -0x16) goto LAB_001ac7be;
    unaff_RBX = close_cb;
    pcStack_1f0 = (code *)0x1ac6e4;
    uv_close((uv_handle_t *)&local_f0,close_cb);
    pcStack_1f0 = (code *)0x1ac6f1;
    uv_close((uv_handle_t *)&local_1d8,close_cb);
    pcStack_1f0 = (code *)0x1ac6f6;
    puVar2 = uv_default_loop();
    pcStack_1f0 = (code *)0x1ac700;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_1e8 = 2;
    local_1e0 = (long)close_cb_called;
    if (local_1e0 != 2) goto LAB_001ac7cb;
    pcStack_1f0 = (code *)0x1ac728;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_1f0 = (code *)0x1ac73c;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_1f0 = (code *)0x1ac746;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    local_1e8 = 0;
    pcStack_1f0 = (code *)0x1ac753;
    puVar2 = uv_default_loop();
    pcStack_1f0 = (code *)0x1ac75b;
    iVar1 = uv_loop_close(puVar2);
    local_1e0 = (long)iVar1;
    if (local_1e8 == local_1e0) {
      pcStack_1f0 = (code *)0x1ac772;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1f0 = (code *)0x1ac78a;
    run_test_pipe_bind_error_addrinuse_cold_1();
LAB_001ac78a:
    pcStack_1f0 = (code *)0x1ac797;
    run_test_pipe_bind_error_addrinuse_cold_2();
LAB_001ac797:
    pcStack_1f0 = (code *)0x1ac7a4;
    run_test_pipe_bind_error_addrinuse_cold_3();
LAB_001ac7a4:
    pcStack_1f0 = (code *)0x1ac7b1;
    run_test_pipe_bind_error_addrinuse_cold_4();
LAB_001ac7b1:
    pcStack_1f0 = (code *)0x1ac7be;
    run_test_pipe_bind_error_addrinuse_cold_5();
LAB_001ac7be:
    pcStack_1f0 = (code *)0x1ac7cb;
    run_test_pipe_bind_error_addrinuse_cold_6();
LAB_001ac7cb:
    pcStack_1f0 = (code *)0x1ac7d8;
    run_test_pipe_bind_error_addrinuse_cold_7();
  }
  plVar4 = &local_1e8;
  pcStack_1f0 = close_cb;
  run_test_pipe_bind_error_addrinuse_cold_8();
  if (plVar4 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  puStack_1f8 = (uv_loop_t *)run_test_pipe_bind_error_addrnotavail;
  close_cb_cold_1();
  puStack_300 = (uv_loop_t *)0x1ac804;
  puStack_1f8 = (uv_loop_t *)unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_300 = (uv_loop_t *)0x1ac813;
  iVar1 = uv_pipe_init(puVar2,&uStack_2e0,0);
  lStack_2e8 = (long)iVar1;
  lStack_2f0 = 0;
  if (lStack_2e8 == 0) {
    puStack_300 = (uv_loop_t *)0x1ac844;
    iVar1 = uv_pipe_bind(&uStack_2e0,"/path/to/unix/socket/that/really/should/not/be/there");
    lStack_2e8 = (long)iVar1;
    lStack_2f0 = -0xd;
    if (lStack_2e8 != -0xd) goto LAB_001ac910;
    puStack_300 = (uv_loop_t *)0x1ac875;
    uv_close((uv_handle_t *)&uStack_2e0,close_cb);
    puStack_300 = (uv_loop_t *)0x1ac87a;
    puVar2 = uv_default_loop();
    puStack_300 = (uv_loop_t *)0x1ac884;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_2e8 = 1;
    lStack_2f0 = (long)close_cb_called;
    if (lStack_2f0 != 1) goto LAB_001ac91f;
    puStack_300 = (uv_loop_t *)0x1ac8aa;
    unaff_RBX = (code *)uv_default_loop();
    puStack_300 = (uv_loop_t *)0x1ac8be;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_300 = (uv_loop_t *)0x1ac8c8;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    lStack_2e8 = 0;
    puStack_300 = (uv_loop_t *)0x1ac8d6;
    puVar2 = uv_default_loop();
    puStack_300 = (uv_loop_t *)0x1ac8de;
    iVar1 = uv_loop_close(puVar2);
    lStack_2f0 = (long)iVar1;
    if (lStack_2e8 == lStack_2f0) {
      puStack_300 = (uv_loop_t *)0x1ac8f6;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_300 = (uv_loop_t *)0x1ac910;
    run_test_pipe_bind_error_addrnotavail_cold_1();
LAB_001ac910:
    puStack_300 = (uv_loop_t *)0x1ac91f;
    run_test_pipe_bind_error_addrnotavail_cold_2();
LAB_001ac91f:
    puStack_300 = (uv_loop_t *)0x1ac92e;
    run_test_pipe_bind_error_addrnotavail_cold_3();
  }
  puStack_300 = (uv_loop_t *)run_test_pipe_bind_error_inval;
  run_test_pipe_bind_error_addrnotavail_cold_4();
  puStack_408 = (uv_loop_t *)0x1ac94a;
  puStack_300 = (uv_loop_t *)unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_408 = (uv_loop_t *)0x1ac959;
  iVar1 = uv_pipe_init(puVar2,&uStack_3e8,0);
  lStack_3f0 = (long)iVar1;
  lStack_3f8 = 0;
  if (lStack_3f0 == 0) {
    puStack_408 = (uv_loop_t *)0x1ac98a;
    iVar1 = uv_pipe_bind(&uStack_3e8,"/tmp/uv-test-sock");
    lStack_3f0 = (long)iVar1;
    lStack_3f8 = 0;
    if (lStack_3f0 != 0) goto LAB_001aca8b;
    puStack_408 = (uv_loop_t *)0x1ac9bb;
    iVar1 = uv_pipe_bind(&uStack_3e8,"/tmp/uv-test-sock2");
    lStack_3f0 = (long)iVar1;
    lStack_3f8 = -0x16;
    if (lStack_3f0 != -0x16) goto LAB_001aca9a;
    puStack_408 = (uv_loop_t *)0x1ac9ec;
    uv_close((uv_handle_t *)&uStack_3e8,close_cb);
    puStack_408 = (uv_loop_t *)0x1ac9f1;
    puVar2 = uv_default_loop();
    puStack_408 = (uv_loop_t *)0x1ac9fb;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_3f0 = 1;
    lStack_3f8 = (long)close_cb_called;
    if (lStack_3f8 != 1) goto LAB_001acaa9;
    puStack_408 = (uv_loop_t *)0x1aca25;
    unaff_RBX = (code *)uv_default_loop();
    puStack_408 = (uv_loop_t *)0x1aca39;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_408 = (uv_loop_t *)0x1aca43;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    lStack_3f0 = 0;
    puStack_408 = (uv_loop_t *)0x1aca51;
    puVar2 = uv_default_loop();
    puStack_408 = (uv_loop_t *)0x1aca59;
    iVar1 = uv_loop_close(puVar2);
    lStack_3f8 = (long)iVar1;
    if (lStack_3f0 == lStack_3f8) {
      puStack_408 = (uv_loop_t *)0x1aca71;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_408 = (uv_loop_t *)0x1aca8b;
    run_test_pipe_bind_error_inval_cold_1();
LAB_001aca8b:
    puStack_408 = (uv_loop_t *)0x1aca9a;
    run_test_pipe_bind_error_inval_cold_2();
LAB_001aca9a:
    puStack_408 = (uv_loop_t *)0x1acaa9;
    run_test_pipe_bind_error_inval_cold_3();
LAB_001acaa9:
    puStack_408 = (uv_loop_t *)0x1acab8;
    run_test_pipe_bind_error_inval_cold_4();
  }
  puStack_408 = (uv_loop_t *)run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  puStack_510 = (uv_loop_t *)0x1acad4;
  puStack_408 = (uv_loop_t *)unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_510 = (uv_loop_t *)0x1acae3;
  iVar1 = uv_pipe_init(puVar2,&uStack_4f0,0);
  lStack_4f8 = (long)iVar1;
  lStack_500 = 0;
  if (lStack_4f8 == 0) {
    puStack_510 = (uv_loop_t *)0x1acb14;
    iVar1 = uv_listen((uv_stream_t *)&uStack_4f0,0x1000,(uv_connection_cb)0x0);
    lStack_4f8 = (long)iVar1;
    lStack_500 = -0x16;
    if (lStack_4f8 != -0x16) goto LAB_001acbe0;
    puStack_510 = (uv_loop_t *)0x1acb45;
    uv_close((uv_handle_t *)&uStack_4f0,close_cb);
    puStack_510 = (uv_loop_t *)0x1acb4a;
    puVar2 = uv_default_loop();
    puStack_510 = (uv_loop_t *)0x1acb54;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_4f8 = 1;
    lStack_500 = (long)close_cb_called;
    if (lStack_500 != 1) goto LAB_001acbef;
    puStack_510 = (uv_loop_t *)0x1acb7a;
    unaff_RBX = (code *)uv_default_loop();
    puStack_510 = (uv_loop_t *)0x1acb8e;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_510 = (uv_loop_t *)0x1acb98;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    lStack_4f8 = 0;
    puStack_510 = (uv_loop_t *)0x1acba6;
    puVar2 = uv_default_loop();
    puStack_510 = (uv_loop_t *)0x1acbae;
    iVar1 = uv_loop_close(puVar2);
    lStack_500 = (long)iVar1;
    if (lStack_4f8 == lStack_500) {
      puStack_510 = (uv_loop_t *)0x1acbc6;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_510 = (uv_loop_t *)0x1acbe0;
    run_test_pipe_listen_without_bind_cold_1();
LAB_001acbe0:
    puStack_510 = (uv_loop_t *)0x1acbef;
    run_test_pipe_listen_without_bind_cold_2();
LAB_001acbef:
    puStack_510 = (uv_loop_t *)0x1acbfe;
    run_test_pipe_listen_without_bind_cold_3();
  }
  puStack_510 = (uv_loop_t *)run_test_pipe_bind_error_long_path;
  run_test_pipe_listen_without_bind_cold_4();
  puVar2 = auStack_d10;
  auStack_f00._232_8_ = (uv_close_cb)0x1acc2f;
  puStack_510 = (uv_loop_t *)unaff_RBX;
  memset(puVar2,0x2e,0x7ff);
  uStack_511 = 0;
  auStack_f00._232_8_ = (uv_close_cb)0x1acc3b;
  puVar3 = uv_default_loop();
  auStack_f00._232_8_ = (uv_close_cb)0x1acc4a;
  iVar1 = uv_pipe_init(puVar3,(uv_pipe_t *)(auStack_f00 + 0x108),0);
  if (iVar1 == 0) {
    auStack_f00._232_8_ = (uv_close_cb)0x1acc64;
    iVar1 = uv_pipe_bind((uv_pipe_t *)(auStack_f00 + 0x108),(char *)auStack_d10);
    if (iVar1 != -0x24) goto LAB_001accf7;
    auStack_f00._232_8_ = (uv_close_cb)0x1acc7e;
    uv_close((uv_handle_t *)(auStack_f00 + 0x108),close_cb);
    auStack_f00._232_8_ = (uv_close_cb)0x1acc83;
    puVar3 = uv_default_loop();
    auStack_f00._232_8_ = (uv_close_cb)0x1acc8d;
    uv_run(puVar3,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_001accfc;
    auStack_f00._232_8_ = (uv_close_cb)0x1acc9b;
    puVar2 = uv_default_loop();
    auStack_f00._232_8_ = (uv_close_cb)0x1accaf;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    auStack_f00._232_8_ = (uv_close_cb)0x1accb9;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_f00._256_8_ = (uv_handle_t *)0x0;
    auStack_f00._232_8_ = (uv_close_cb)0x1accc7;
    puVar3 = uv_default_loop();
    auStack_f00._232_8_ = (uv_close_cb)0x1acccf;
    iVar1 = uv_loop_close(puVar3);
    auStack_f00._248_8_ = SEXT48(iVar1);
    if (auStack_f00._256_8_ == auStack_f00._248_8_) {
      auStack_f00._232_8_ = (uv_close_cb)0x1acce7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_f00._232_8_ = (uv_close_cb)0x1accf7;
    run_test_pipe_bind_error_long_path_cold_1();
LAB_001accf7:
    auStack_f00._232_8_ = (uv_close_cb)0x1accfc;
    run_test_pipe_bind_error_long_path_cold_2();
LAB_001accfc:
    auStack_f00._232_8_ = (uv_close_cb)0x1acd01;
    run_test_pipe_bind_error_long_path_cold_3();
  }
  auStack_f00._232_8_ = run_test_pipe_bind_or_listen_error_after_close;
  run_test_pipe_bind_error_long_path_cold_4();
  puStack_f20 = (uv_loop_t *)0x1acd1d;
  auStack_f00._232_8_ = puVar2;
  puVar3 = uv_default_loop();
  puStack_f20 = (uv_loop_t *)0x1acd2c;
  iVar1 = uv_pipe_init(puVar3,(uv_pipe_t *)auStack_f00,0);
  lStack_f08 = (long)iVar1;
  lStack_f10 = 0;
  if (lStack_f08 == 0) {
    puVar2 = (uv_loop_t *)auStack_f00;
    puStack_f20 = (uv_loop_t *)0x1acd5b;
    uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
    puStack_f20 = (uv_loop_t *)0x1acd6a;
    iVar1 = uv_pipe_bind((uv_pipe_t *)puVar2,"/tmp/uv-test-sock");
    lStack_f08 = (long)iVar1;
    lStack_f10 = -0x16;
    if (lStack_f08 != -0x16) goto LAB_001ace55;
    puStack_f20 = (uv_loop_t *)0x1acd9b;
    iVar1 = uv_listen((uv_stream_t *)auStack_f00,0x1000,(uv_connection_cb)0x0);
    lStack_f08 = (long)iVar1;
    lStack_f10 = -0x16;
    if (lStack_f08 != -0x16) goto LAB_001ace64;
    puStack_f20 = (uv_loop_t *)0x1acdc0;
    puVar3 = uv_default_loop();
    puStack_f20 = (uv_loop_t *)0x1acdca;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_f08 = (long)iVar1;
    lStack_f10 = 0;
    if (lStack_f08 != 0) goto LAB_001ace73;
    puStack_f20 = (uv_loop_t *)0x1acdef;
    puVar2 = uv_default_loop();
    puStack_f20 = (uv_loop_t *)0x1ace03;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    puStack_f20 = (uv_loop_t *)0x1ace0d;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_f08 = 0;
    puStack_f20 = (uv_loop_t *)0x1ace1b;
    puVar3 = uv_default_loop();
    puStack_f20 = (uv_loop_t *)0x1ace23;
    iVar1 = uv_loop_close(puVar3);
    lStack_f10 = (long)iVar1;
    if (lStack_f08 == lStack_f10) {
      puStack_f20 = (uv_loop_t *)0x1ace3b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_f20 = (uv_loop_t *)0x1ace55;
    run_test_pipe_bind_or_listen_error_after_close_cold_1();
LAB_001ace55:
    puStack_f20 = (uv_loop_t *)0x1ace64;
    run_test_pipe_bind_or_listen_error_after_close_cold_2();
LAB_001ace64:
    puStack_f20 = (uv_loop_t *)0x1ace73;
    run_test_pipe_bind_or_listen_error_after_close_cold_3();
LAB_001ace73:
    puStack_f20 = (uv_loop_t *)0x1ace82;
    run_test_pipe_bind_or_listen_error_after_close_cold_4();
  }
  puStack_f20 = (uv_loop_t *)run_test_pipe_overlong_path;
  run_test_pipe_bind_or_listen_error_after_close_cold_5();
  puVar5 = auStack_1288 + 8;
  auStack_1288._0_8_ = (void *)0x1ace9e;
  puStack_f20 = puVar2;
  puVar2 = uv_default_loop();
  auStack_1288._0_8_ = (void *)0x1acead;
  iVar1 = uv_pipe_init(puVar2,&uStack_1208,0);
  alStack_1120[0] = (long)iVar1;
  uStack_1270.data = (uv_loop_t *)0x0;
  if (alStack_1120[0] == 0) {
    auStack_1288._0_8_ = (void *)0x1aceed;
    memset(alStack_1120,0x40,0x200);
    uStack_1270.data = (uv_loop_t *)0xffffffffffffffdc;
    auStack_1288._0_8_ = (void *)0x1acf0d;
    iVar1 = uv_pipe_bind2(&uStack_1208,(char *)alStack_1120,0x200,1);
    auStack_1288._8_8_ = SEXT48(iVar1);
    if (uStack_1270.data != (void *)auStack_1288._8_8_) goto LAB_001ad0c1;
    auStack_1288._8_8_ = (uv_loop_t *)0xffffffffffffffdc;
    auStack_1288._0_8_ = (void *)0x1acf53;
    iVar1 = uv_pipe_connect2(&uStack_1270,&uStack_1208,(char *)alStack_1120,0x200,1,abort);
    puStack_1278 = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_1288._8_8_ != puStack_1278) goto LAB_001ad0ce;
    auStack_1288._0_8_ = (void *)0x1acf6e;
    puVar2 = uv_default_loop();
    auStack_1288._0_8_ = (void *)0x1acf78;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_1288._8_8_ = SEXT48(iVar1);
    puStack_1278 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1288._8_8_ != (uv_loop_t *)0x0) goto LAB_001ad0db;
    auStack_1288._8_8_ = (uv_loop_t *)0xffffffffffffffea;
    auStack_1288._0_8_ = (void *)0x1acfaf;
    iVar1 = uv_pipe_bind(&uStack_1208,"");
    puStack_1278 = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_1288._8_8_ != puStack_1278) goto LAB_001ad0e8;
    auStack_1288._0_8_ = (void *)0x1acfe2;
    uv_pipe_connect(&uStack_1270,&uStack_1208,"",connect_overlong_cb);
    auStack_1288._0_8_ = (void *)0x1acfe7;
    puVar2 = uv_default_loop();
    auStack_1288._0_8_ = (void *)0x1acff1;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_1288._8_8_ = SEXT48(iVar1);
    puStack_1278 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1288._8_8_ != (uv_loop_t *)0x0) goto LAB_001ad0f5;
    auStack_1288._8_8_ = (uv_loop_t *)0x1;
    puStack_1278 = (uv_loop_t *)(long)connect_cb_called;
    if (puStack_1278 != (uv_loop_t *)0x1) goto LAB_001ad102;
    auStack_1288._8_8_ = (uv_loop_t *)0x1;
    puStack_1278 = (uv_loop_t *)(long)close_cb_called;
    if (puStack_1278 == (uv_loop_t *)0x1) {
      auStack_1288._0_8_ = (void *)0x1ad05a;
      puVar2 = uv_default_loop();
      auStack_1288._0_8_ = (void *)0x1ad06e;
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      auStack_1288._0_8_ = (void *)0x1ad078;
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_1288._8_8_ = (uv_loop_t *)0x0;
      auStack_1288._0_8_ = (void *)0x1ad085;
      puVar2 = uv_default_loop();
      auStack_1288._0_8_ = (void *)0x1ad08d;
      iVar1 = uv_loop_close(puVar2);
      puStack_1278 = (uv_loop_t *)(long)iVar1;
      if ((uv_loop_t *)auStack_1288._8_8_ == puStack_1278) {
        auStack_1288._0_8_ = (void *)0x1ad0a4;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ad11c;
    }
  }
  else {
    auStack_1288._0_8_ = (void *)0x1ad0c1;
    run_test_pipe_overlong_path_cold_1();
LAB_001ad0c1:
    auStack_1288._0_8_ = (void *)0x1ad0ce;
    run_test_pipe_overlong_path_cold_2();
LAB_001ad0ce:
    auStack_1288._0_8_ = (void *)0x1ad0db;
    run_test_pipe_overlong_path_cold_3();
LAB_001ad0db:
    auStack_1288._0_8_ = (void *)0x1ad0e8;
    run_test_pipe_overlong_path_cold_4();
LAB_001ad0e8:
    auStack_1288._0_8_ = (void *)0x1ad0f5;
    run_test_pipe_overlong_path_cold_5();
LAB_001ad0f5:
    auStack_1288._0_8_ = (void *)0x1ad102;
    run_test_pipe_overlong_path_cold_6();
LAB_001ad102:
    auStack_1288._0_8_ = (void *)0x1ad10f;
    run_test_pipe_overlong_path_cold_7();
  }
  auStack_1288._0_8_ = (void *)0x1ad11c;
  run_test_pipe_overlong_path_cold_8();
LAB_001ad11c:
  iVar1 = (int)&puStack_1278;
  auStack_1288._0_8_ = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  auStack_1288._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_1288._0_8_ == (void *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    uv_close(*(uv_handle_t **)(puVar5 + 0x50),close_cb);
    return extraout_EAX_00;
  }
  handle = (uv_handle_t *)auStack_1288;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(pipe_bind_error_addrinuse) {
  uv_pipe_t server1, server2;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server1, 0);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server1, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_pipe_init(uv_default_loop(), &server2, 0);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server2, TEST_PIPENAME);
  ASSERT_EQ(r, UV_EADDRINUSE);

  r = uv_listen((uv_stream_t*)&server1, SOMAXCONN, NULL);
  ASSERT_OK(r);
  r = uv_listen((uv_stream_t*)&server2, SOMAXCONN, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}